

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O0

bool AbslInternalPerThreadSemWait(KernelTimeout t)

{
  bool bVar1;
  ThreadIdentity *identity_00;
  FutexWaiter *this;
  int local_c4;
  int ticker;
  ThreadIdentity *identity;
  bool timeout;
  KernelTimeout t_local;
  memory_order __b;
  memory_order __b_2;
  memory_order __b_1;
  
  identity_00 = absl::synchronization_internal::GetOrCreateCurrentThreadIdentity();
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_c4 = (identity_00->ticker).super___atomic_base<int>._M_i;
  if (local_c4 == 0) {
    local_c4 = 1;
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity_00->wait_start).super___atomic_base<int>._M_i = local_c4;
  std::atomic<bool>::store(&identity_00->is_idle,false,memory_order_relaxed);
  if (identity_00->blocked_count_ptr != (atomic<int> *)0x0) {
    LOCK();
    (identity_00->blocked_count_ptr->super___atomic_base<int>)._M_i =
         (identity_00->blocked_count_ptr->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  this = absl::synchronization_internal::WaiterCrtp<absl::synchronization_internal::FutexWaiter>::
         GetWaiter(identity_00);
  bVar1 = absl::synchronization_internal::FutexWaiter::Wait(this,t);
  if (identity_00->blocked_count_ptr != (atomic<int> *)0x0) {
    LOCK();
    (identity_00->blocked_count_ptr->super___atomic_base<int>)._M_i =
         (identity_00->blocked_count_ptr->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  std::atomic<bool>::store(&identity_00->is_idle,false,memory_order_relaxed);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity_00->wait_start).super___atomic_base<int>._M_i = 0;
  return (bool)(((bVar1 ^ 0xffU) & 1 ^ 0xff) & 1);
}

Assistant:

ABSL_ATTRIBUTE_WEAK bool ABSL_INTERNAL_C_SYMBOL(AbslInternalPerThreadSemWait)(
    absl::synchronization_internal::KernelTimeout t) {
  bool timeout = false;
  absl::base_internal::ThreadIdentity *identity;
  identity = absl::synchronization_internal::GetOrCreateCurrentThreadIdentity();

  // Ensure wait_start != 0.
  int ticker = identity->ticker.load(std::memory_order_relaxed);
  identity->wait_start.store(ticker ? ticker : 1, std::memory_order_relaxed);
  identity->is_idle.store(false, std::memory_order_relaxed);

  if (identity->blocked_count_ptr != nullptr) {
    // Increment count of threads blocked in a given thread pool.
    identity->blocked_count_ptr->fetch_add(1, std::memory_order_relaxed);
  }

  timeout =
      !absl::synchronization_internal::Waiter::GetWaiter(identity)->Wait(t);

  if (identity->blocked_count_ptr != nullptr) {
    identity->blocked_count_ptr->fetch_sub(1, std::memory_order_relaxed);
  }

  identity->is_idle.store(false, std::memory_order_relaxed);
  identity->wait_start.store(0, std::memory_order_relaxed);
  return !timeout;
}